

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::additive_expr(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  TYPE TVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  int local_128 [2];
  token local_120;
  undefined1 local_f8 [32];
  undefined1 local_d8 [8];
  NodePtr tmp_in_ptr;
  undefined1 local_b8 [8];
  NodePtr tmp_cur_ptr;
  token local_a0;
  undefined1 local_78 [32];
  shared_ptr<dh::TreeNode> local_58 [2];
  undefined1 local_38 [8];
  NodePtr tmp_ptr;
  NodePtr ret;
  analysis *this_local;
  
  std::shared_ptr<dh::TreeNode>::shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  multiplicative_expr((analysis *)local_38);
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  TVar1 = token::getType(peVar2);
  if (TVar1 == ADDOP) {
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_((token *)local_78);
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    local_a0._lineno = token::getLineno(peVar2);
    std::make_shared<dh::TreeNode,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (int *)local_78);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_58);
    std::shared_ptr<dh::TreeNode>::~shared_ptr(local_58);
    std::__cxx11::string::~string((string *)local_78);
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_(&local_a0);
    match(in_RSI,&local_a0._val);
    std::__cxx11::string::~string((string *)&local_a0);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = 1;
    TreeNode::setNodeKind
              (peVar3,(int *)((long)&tmp_cur_ptr.
                                     super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 4));
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = 5;
    TreeNode::setKind(peVar3,(int *)&tmp_cur_ptr.
                                     super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    TreeNode::appendChild(peVar3,(NodePtr *)local_38);
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)local_b8,
               (shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    while( true ) {
      multiplicative_expr((analysis *)
                          &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      __r = &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<dh::TreeNode>::operator=
                ((shared_ptr<dh::TreeNode> *)local_38,(shared_ptr<dh::TreeNode> *)__r);
      std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)__r);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
      TreeNode::appendChild(peVar3,(shared_ptr<dh::TreeNode> *)local_38);
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar1 = token::getType(peVar2);
      if (TVar1 != ADDOP) break;
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_((token *)local_f8);
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      local_120._lineno = token::getLineno(peVar2);
      std::make_shared<dh::TreeNode,std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (int *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_(&local_120);
      match(in_RSI,&local_120._val);
      std::__cxx11::string::~string((string *)&local_120);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
      local_128[1] = 1;
      TreeNode::setNodeKind(peVar3,local_128 + 1);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
      local_128[0] = 5;
      TreeNode::setKind(peVar3,local_128);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
      TreeNode::appendChild(peVar3,(NodePtr *)local_b8);
      std::shared_ptr<dh::TreeNode>::operator=
                ((shared_ptr<dh::TreeNode> *)local_b8,(shared_ptr<dh::TreeNode> *)local_d8);
      std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_d8);
    }
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<dh::TreeNode> *)local_b8);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_b8);
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)this,
               (shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)this,(shared_ptr<dh::TreeNode> *)local_38);
  }
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_38);
  std::shared_ptr<dh::TreeNode>::~shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::additive_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in additive_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr = multiplicative_expr();

	if ( tmp->getType() == TYPE::ADDOP)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		match(tmp->getVal());

		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::AdditiveK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = multiplicative_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);

			if ( tmp->getType() == TYPE::ADDOP)
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
				match(tmp->getVal());
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::AdditiveK);
				tmp_in_ptr->appendChild(tmp_cur_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				ret = tmp_cur_ptr;
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}